

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

void int_io_close(int fd)

{
  uint uVar1;
  int iVar2;
  int fd_local;
  
  uVar1 = fcntl(fd,3,0);
  iVar2 = fcntl(fd,4,(ulong)(uVar1 & 0xffffdfff));
  if (iVar2 == -1) {
    perror("fcntl_F_SETFL off error");
  }
  return;
}

Assistant:

void int_io_close(int fd)
{
  DBPRINT(("int_io_close %d\n", fd));
#ifdef DOS
/* Turn off signaller here */
#elif defined(O_ASYNC)
  if (fcntl(fd, F_SETFL, fcntl(fd, F_GETFL, 0) & ~O_ASYNC) == -1) perror("fcntl_F_SETFL off error");
#elif defined(FASYNC) && defined(FNDELAY)
  if (fcntl(fd, F_SETFL, fcntl(fd, F_GETFL, 0) & ~(FNDELAY | FASYNC)) == -1) perror("fcntl F_SETFL off error");
#endif
}